

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

int __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::cmpIgnoreCase_pcu
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,StringRef *string)

{
  C CVar1;
  C CVar2;
  long in_RSI;
  ulong *in_RDI;
  C c2;
  C c1;
  C *end;
  C *p2;
  C *p1;
  size_t length;
  uint local_54;
  ulong local_50;
  ulong local_28;
  
  if (in_RDI[2] < *(ulong *)(in_RSI + 0x10)) {
    local_50 = in_RDI[2];
  }
  else {
    local_50 = *(ulong *)(in_RSI + 0x10);
  }
  local_28 = *in_RDI;
  local_50 = local_28 + local_50;
  while( true ) {
    if (local_50 <= local_28) {
      if (in_RDI[2] < *(ulong *)(in_RSI + 0x10)) {
        local_54 = 0xffffffff;
      }
      else {
        local_54 = (uint)(*(ulong *)(in_RSI + 0x10) < in_RDI[2]);
      }
      return local_54;
    }
    CVar1 = StringDetailsBase<char>::toLower('\0');
    CVar2 = StringDetailsBase<char>::toLower('\0');
    if (CVar1 < CVar2) break;
    if (CVar2 < CVar1) {
      return 1;
    }
    local_28 = local_28 + 1;
  }
  return -1;
}

Assistant:

int
	cmpIgnoreCase_pcu(const StringRef& string) const {
		size_t length = AXL_MIN(m_length, string.m_length);

		const C* p1 = m_p;
		const C* p2 = string.m_p;
		const C* end = p1 + length;
		for (; p1 < end; p1++, p2++) {
			C c1 = Details::toLower(*p1);
			C c2 = Details::toLower(*p2);

			if (c1 < c2)
				return -1;
			else if (c1 > c2)
				return 1;
		}

		return
			m_length < string.m_length ? -1 :
			m_length > string.m_length ? 1 : 0;
	}